

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_rkv.c
# Opt level: O1

MPP_RET hal_avs2d_rkv_dump_stream(void *hal,HalTaskInfo *task)

{
  MPP_RET MVar1;
  void *__ptr;
  FILE *__s;
  size_t __n;
  MppBuffer buffer;
  char name [50];
  MppBuffer local_60;
  char local_58 [64];
  
  local_60 = (MppBuffer)0x0;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x18),(task->dec).input,SLOT_BUFFER,&local_60);
  __ptr = mpp_buffer_get_ptr_with_caller(local_60,"hal_avs2d_rkv_dump_stream");
  snprintf(local_58,0x32,"/data/tmp/rkv_stream_in_%03d.bin",(ulong)*(uint *)((long)hal + 0x5c0));
  __s = fopen(local_58,"wb");
  __n = mpp_packet_get_length((task->dec).input_packet);
  fwrite(__ptr,1,__n,__s);
  MVar1 = fclose(__s);
  return MVar1;
}

Assistant:

static MPP_RET hal_avs2d_rkv_dump_stream(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    FILE *fp_stream = NULL;
    char name[50];
    MppBuffer buffer = NULL;
    void *base = NULL;
    mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &buffer);
    base = mpp_buffer_get_ptr(buffer);
    snprintf(name, sizeof(name), "/data/tmp/rkv_stream_in_%03d.bin", p_hal->frame_no);
    fp_stream = fopen(name, "wb");
    fwrite(base, 1, mpp_packet_get_length(task->dec.input_packet), fp_stream);
    fclose(fp_stream);

    return ret;
}